

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O2

Hop_Obj_t *
Abc_NodeCollapseFunc1
          (Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,Vec_Ptr_t *vFanins,int *pPermFanin,int *pPermFanout)

{
  Hop_Man_t *p;
  int iVar1;
  int iVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pRoot;
  int iFanin;
  int local_3c;
  int *local_38;
  
  p = (Hop_Man_t *)pFanin->pNtk->pManFunc;
  iVar1 = Abc_NodeCheckDupFanin(pFanin,pFanout,&local_3c);
  if (iVar1 == 1) {
    local_38 = pPermFanin;
    iVar1 = Abc_NodeCollapseSuppSize(pFanin,pFanout,vFanins);
    Hop_IthVar(p,iVar1);
    if (p->nObjs[2] <= iVar1) {
      __assert_fail("nSize + 1 <= Hop_ManPiNum(pMan)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                    ,0x226,
                    "Hop_Obj_t *Abc_NodeCollapseFunc1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                   );
    }
    iVar2 = Abc_NodeCollapsePermMap(pFanin,(Abc_Obj_t *)0x0,vFanins,local_38);
    if (iVar2 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                    ,0x229,
                    "Hop_Obj_t *Abc_NodeCollapseFunc1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                   );
    }
    iVar2 = Abc_NodeCollapsePermMap(pFanout,pFanin,vFanins,pPermFanout);
    if (iVar2 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                    ,0x22b,
                    "Hop_Obj_t *Abc_NodeCollapseFunc1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)"
                   );
    }
    pPermFanout[local_3c] = iVar1;
    pHVar3 = Hop_Permute(p,(Hop_Obj_t *)(pFanin->field_5).pData,(pFanin->vFanins).nSize,local_38);
    pRoot = Hop_Permute(p,(Hop_Obj_t *)(pFanout->field_5).pData,(pFanout->vFanins).nSize,pPermFanout
                       );
    pHVar3 = Hop_Compose(p,pRoot,pHVar3,iVar1);
  }
  else {
    pHVar3 = (Hop_Obj_t *)0x0;
  }
  return pHVar3;
}

Assistant:

Hop_Obj_t * Abc_NodeCollapseFunc1( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, Vec_Ptr_t * vFanins, int * pPermFanin, int * pPermFanout )
{
    Hop_Man_t * pMan = (Hop_Man_t *)pFanin->pNtk->pManFunc;
    Hop_Obj_t * bFanin, * bFanout;
    int RetValue, nSize, iFanin;
    // can only eliminate if fanin occurs in the fanin list of the fanout exactly once
    if ( Abc_NodeCheckDupFanin( pFanin, pFanout, &iFanin ) != 1 )
        return NULL;
    // find the new number of fanins after collapsing
    nSize = Abc_NodeCollapseSuppSize( pFanin, pFanout, vFanins );
    Hop_IthVar( pMan, nSize ); // use additional var for fanin variable
    assert( nSize + 1 <= Hop_ManPiNum(pMan) );
    // find the permutation after collapsing
    RetValue = Abc_NodeCollapsePermMap( pFanin, NULL, vFanins, pPermFanin );
    assert( RetValue );
    RetValue = Abc_NodeCollapsePermMap( pFanout, pFanin, vFanins, pPermFanout );
    assert( RetValue );
    // include fanin's variable
    pPermFanout[iFanin] = nSize;
    // create new function of fanin and fanout
    bFanin  = Hop_Permute( pMan, (Hop_Obj_t *)pFanin->pData,  Abc_ObjFaninNum(pFanin),  pPermFanin );
    bFanout = Hop_Permute( pMan, (Hop_Obj_t *)pFanout->pData, Abc_ObjFaninNum(pFanout), pPermFanout );
    // compose fanin into fanout
    return Hop_Compose( pMan, bFanout, bFanin, nSize );
}